

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O0

void __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~buffer_queue(buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lck;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  lck._M_device = &this->b_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->b_mutex);
  if ((this->b_array != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     (pbVar1 = this->b_array,
     pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    lVar2 = *(long *)((long)&pbVar1[-1].field_2 + 8);
    this_00 = pbVar1 + lVar2;
    while (pbVar1 != this_00) {
      this_00 = this_00 + -1;
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete__((void *)((long)&pbVar1[-1].field_2 + 8),lVar2 * 0x20 + 8);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::condition_variable::~condition_variable(&this->b_cond);
  return;
}

Assistant:

~buffer_queue()
    {
        lock_guard<mutex> lck (b_mutex);
        if (b_array != NULL)
            delete [] b_array;
    }